

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.h
# Opt level: O2

PerspectiveCameraData * __thiscall
embree::SceneGraph::AnimatedPerspectiveCameraNode::get
          (PerspectiveCameraData *__return_storage_ptr__,AnimatedPerspectiveCameraNode *this,
          float time)

{
  pointer pRVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  float fVar5;
  float fVar6;
  PerspectiveCameraData local_a8;
  PerspectiveCameraData local_68;
  
  fVar5 = (this->time_range).lower;
  fVar5 = (time - fVar5) / ((this->time_range).upper - fVar5);
  fVar6 = floorf(fVar5);
  pRVar1 = (this->cameras).
           super__Vector_base<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>,_std::allocator<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar4 = (long)(this->cameras).
                super__Vector_base<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>,_std::allocator<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>_>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)pRVar1 >> 3;
  fVar6 = (fVar5 - fVar6) * (float)(lVar4 - 1);
  fVar5 = floorf(fVar6);
  iVar2 = 0;
  if (0 < (int)fVar5) {
    iVar2 = (int)fVar5;
  }
  iVar3 = (int)lVar4 + -2;
  if (iVar2 < iVar3) {
    iVar3 = iVar2;
  }
  (**(code **)((long)((pRVar1[iVar3].ptr)->super_Node).super_RefCount._vptr_RefCount + 0x80))
            (&local_68);
  (**(code **)((long)(((this->cameras).
                       super__Vector_base<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>,_std::allocator<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[(long)iVar3 + 1].ptr)->super_Node).
                     super_RefCount._vptr_RefCount + 0x80))(fVar6,&local_a8);
  lerp(__return_storage_ptr__,&local_68,&local_a8,fVar6 - (float)iVar3);
  return __return_storage_ptr__;
}

Assistant:

virtual PerspectiveCameraData get(float time) const
      {
        time = frac((time-time_range.lower)/time_range.size());
        time = (cameras.size()-1)*time;
        int   itime = (int)floor(time);
        itime = min(max(itime,0),(int)cameras.size()-2);
        float ftime = time - (float)itime;
        return lerp(cameras[itime+0]->get(time), cameras[itime+1]->get(time), ftime);
      }